

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updatevector.h
# Opt level: O0

void __thiscall
soplex::
UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::UpdateVector(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_dim,shared_ptr<soplex::Tolerances> *tols)

{
  cpp_dec_float<100U,_int,_void> *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  longlong in_stack_ffffffffffffff88;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffb0;
  undefined4 local_3c [4];
  undefined4 local_2c;
  undefined8 local_20;
  undefined4 *local_18;
  long local_10;
  undefined4 *local_8;
  
  local_2c = in_ESI;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDX,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  local_10 = in_RDI + 0x18;
  local_3c[0] = 0;
  local_18 = local_3c;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_RDX,in_stack_ffffffffffffff88,
             (type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)CONCAT44(local_2c,in_stack_ffffffffffffff80),
             (shared_ptr<soplex::Tolerances> *)(in_RDI + 0x68));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4ae957);
  return;
}

Assistant:

explicit
   UpdateVector(int p_dim /*=0*/, std::shared_ptr<Tolerances> tols = nullptr)
      : VectorBase<R> (p_dim)
      , theval(0)
      , thedelta(p_dim, tols)
   {
      assert(isConsistent());
   }